

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

double av1_get_compression_ratio(AV1_COMMON *cm,size_t encoded_frame_size)

{
  char cVar1;
  undefined1 auVar2 [16];
  long local_48;
  int local_3c;
  int64_t uncompressed_frame_size;
  int pic_size_profile_factor;
  BITSTREAM_PROFILE profile;
  SequenceHeader *seq_params;
  int64_t luma_pic_size;
  int height;
  int upscaled_width;
  size_t encoded_frame_size_local;
  AV1_COMMON *cm_local;
  
  cVar1 = cm->seq_params->profile;
  if (cVar1 == '\0') {
    local_3c = 0xf;
  }
  else {
    local_3c = 0x24;
    if (cVar1 == '\x01') {
      local_3c = 0x1e;
    }
  }
  if (encoded_frame_size < 0x82) {
    local_48 = 1;
  }
  else {
    local_48 = encoded_frame_size - 0x80;
  }
  auVar2._8_4_ = (int)((ulong)local_48 >> 0x20);
  auVar2._0_8_ = local_48;
  auVar2._12_4_ = 0x45300000;
  return (double)((long)cm->superres_upscaled_width * (long)cm->height * (long)local_3c >> 3) /
         ((auVar2._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0));
}

Assistant:

double av1_get_compression_ratio(const AV1_COMMON *const cm,
                                 size_t encoded_frame_size) {
  const int upscaled_width = cm->superres_upscaled_width;
  const int height = cm->height;
  const int64_t luma_pic_size = (int64_t)upscaled_width * height;
  const SequenceHeader *const seq_params = cm->seq_params;
  const BITSTREAM_PROFILE profile = seq_params->profile;
  const int pic_size_profile_factor =
      profile == PROFILE_0 ? 15 : (profile == PROFILE_1 ? 30 : 36);
  encoded_frame_size =
      (encoded_frame_size > 129 ? encoded_frame_size - 128 : 1);
  const int64_t uncompressed_frame_size =
      (luma_pic_size * pic_size_profile_factor) >> 3;
  return (double)uncompressed_frame_size / encoded_frame_size;
}